

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererTests::SubpixelPrecisionIsRespectedWhileRendering(RendererTests *this)

{
  cell *pcVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  int iVar5;
  cell *pcVar6;
  cell *pcVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  scanline_cells sVar11;
  scanline_cells sVar12;
  mask<11UL> mask2;
  mask<7UL> mask1;
  cell cells21 [2];
  cell cells11 [2];
  scanline_cells cells2 [1];
  scanline_cells cells1 [1];
  scanline_mockup local_158;
  LocationInfo local_130;
  undefined1 local_108 [40];
  string local_e0;
  mask<7UL> local_c0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 local_60 [8];
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_58;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_48;
  
  local_158.excepted_y = -1000000;
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_158._25_8_ = 0;
  local_158._current_y = 0x7fffffff;
  local_48.second = (cell *)local_60;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0xb00000011;
  local_68 = 0xffffffef00000000;
  local_48.first = (cell *)local_78;
  mocks::mask<7ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
            ((mask<7ul> *)&local_c0,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [1])
             &local_48,0xd);
  if (0 < local_c0._height) {
    iVar9 = local_c0._min_y;
    do {
      sVar11 = mocks::mask<7UL>::operator[](&local_c0,iVar9);
      pcVar7 = sVar11.second;
      pcVar6 = sVar11.first;
      bVar4 = anon_unknown_1::scanline_mockup::begin(&local_158,iVar9);
      if (bVar4) {
        if (pcVar6 != pcVar7) {
          uVar8 = 0;
LAB_0016d104:
          iVar10 = pcVar6->x;
          iVar5 = 0;
          pcVar1 = pcVar6;
          do {
            pcVar6 = pcVar1 + 1;
            iVar5 = iVar5 + pcVar1->area;
            uVar8 = uVar8 + pcVar1->cover;
            if (pcVar6 == pcVar7) break;
            pcVar1 = pcVar6;
          } while (pcVar6->x == iVar10);
          if (iVar5 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_158,iVar10,uVar8 * 0x100 - iVar5);
            iVar10 = iVar10 + 1;
          }
          if (pcVar6 != pcVar7) {
            iVar5 = pcVar6->x - iVar10;
            if ((uVar8 & 0xffffff) != 0 && iVar5 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_158,iVar10,iVar5,uVar8 * 0x100);
            }
            goto LAB_0016d104;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_158);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < local_c0._height + local_c0._min_y);
  }
  local_130.filename._M_dataplus._M_p = (pointer)&local_130.filename.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_108,&local_130.filename,0x196);
  psVar3 = local_158.spans_log.
           super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (pointer)CONCAT71(local_158.spans_log.
                             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                             local_158.spans_log.
                             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((ut *)&DAT_001a0da0,
             (span (*) [1])
             local_158.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)psVar2,(LocationInfo *)local_108);
  if ((undefined1 *)CONCAT44(local_108._4_4_,local_108._0_4_) != local_108 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_108._4_4_,local_108._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.filename._M_dataplus._M_p != &local_130.filename.field_2) {
    operator_delete(local_130.filename._M_dataplus._M_p);
  }
  local_58.second = (cell *)local_80;
  local_98._0_8_ = 2;
  local_98._8_8_ = 0xa00000011;
  local_88 = 0xffffffef00000000;
  local_58.first = (cell *)local_98;
  mocks::mask<11ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
            ((mask<11ul> *)local_108,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [1])
             &local_58,0x17);
  if (psVar2 != psVar3) {
    local_158.spans_log.
    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = SUB81(psVar3,0);
    local_158.spans_log.
    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)psVar3 >> 8);
  }
  if (0 < (int)local_108._8_4_) {
    iVar9 = local_108._4_4_;
    do {
      sVar12 = mocks::mask<11UL>::operator[]((mask<11UL> *)local_108,iVar9);
      pcVar7 = sVar12.second;
      pcVar6 = sVar12.first;
      bVar4 = anon_unknown_1::scanline_mockup::begin(&local_158,iVar9);
      if (bVar4) {
        if (pcVar6 != pcVar7) {
          uVar8 = 0;
LAB_0016d2ac:
          iVar10 = pcVar6->x;
          iVar5 = 0;
          pcVar1 = pcVar6;
          do {
            pcVar6 = pcVar1 + 1;
            iVar5 = iVar5 + pcVar1->area;
            uVar8 = uVar8 + pcVar1->cover;
            if (pcVar6 == pcVar7) break;
            pcVar1 = pcVar6;
          } while (pcVar6->x == iVar10);
          if (iVar5 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_158,iVar10,uVar8 * 0x1000 - iVar5);
            iVar10 = iVar10 + 1;
          }
          if (pcVar6 != pcVar7) {
            iVar5 = pcVar6->x - iVar10;
            if ((uVar8 & 0xfffff) != 0 && iVar5 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_158,iVar10,iVar5,uVar8 * 0x1000);
            }
            goto LAB_0016d2ac;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_158);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < (int)(local_108._8_4_ + local_108._4_4_));
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_130,&local_e0,0x1a7);
  psVar2 = local_158.spans_log.
           super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((ut *)&DAT_001a0db0,
             (span (*) [1])
             local_158.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)CONCAT71(local_158.spans_log.
                         super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                         local_158.spans_log.
                         super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_1_),&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.filename._M_dataplus._M_p != &local_130.filename.field_2) {
    operator_delete(local_130.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((void *)local_108._16_8_ != (void *)0x0) {
    operator_delete((void *)local_108._16_8_);
  }
  if (local_c0._cells.
      super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0._cells.
                    super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2);
  }
  return;
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}